

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movegen.c
# Opt level: O0

void MOVEGEN_rook(int position,bitboard_t own,bitboard_t opponent,bitboard_t *moves,
                 bitboard_t *captures)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  int blocker_pos;
  bitboard_t blockers;
  bitboard_t rook_moves;
  bitboard_t down_moves;
  bitboard_t up_moves;
  bitboard_t right_moves;
  bitboard_t left_moves;
  bitboard_t occupied;
  bitboard_t *captures_local;
  bitboard_t *moves_local;
  bitboard_t opponent_local;
  bitboard_t own_local;
  int position_local;
  
  uVar8 = own | opponent;
  uVar9 = bitboard_left[position];
  iVar7 = BITBOARD_find_bit_reversed(uVar9 & uVar8 | 1);
  uVar1 = bitboard_left[iVar7];
  uVar2 = bitboard_right[position];
  iVar7 = BITBOARD_find_bit(uVar2 & uVar8 | 0x8000000000000000);
  uVar3 = bitboard_right[iVar7];
  uVar4 = bitboard_up[position];
  iVar7 = BITBOARD_find_bit(uVar4 & uVar8 | 0x8000000000000000);
  uVar5 = bitboard_up[iVar7];
  uVar6 = bitboard_down[position];
  iVar7 = BITBOARD_find_bit_reversed(uVar6 & uVar8 | 1);
  uVar9 = uVar1 ^ uVar9 | uVar3 ^ uVar2 | uVar5 ^ uVar4 | bitboard_down[iVar7] ^ uVar6;
  *moves = uVar9 & (uVar8 ^ 0xffffffffffffffff);
  *captures = uVar9 & opponent;
  return;
}

Assistant:

void MOVEGEN_rook(const int position, const bitboard_t own, const bitboard_t opponent, bitboard_t *moves, bitboard_t *captures)
{
#ifdef __BMI2__
    bitboard_t occupied = own | opponent;
    bitboard_t all_moves = bitboard_rook_attacks[rook_attacks_offset[position] + _pext_u64(occupied, bitboard_rook_inner[position])];
    *moves = all_moves & ~occupied;
    *captures = all_moves & opponent;
#else
    bitboard_t occupied;
    bitboard_t left_moves, right_moves, up_moves, down_moves;
    bitboard_t rook_moves;
    bitboard_t blockers;
    int blocker_pos;
    
    occupied = own | opponent;
    
    /* LEFT */
    left_moves = bitboard_left[position];
    blockers = left_moves & occupied;
    blocker_pos = BITBOARD_find_bit_reversed(blockers | 1);
    left_moves ^= bitboard_left[blocker_pos];

    /* RIGHT */
    right_moves = bitboard_right[position];
    blockers = right_moves & occupied;
    blocker_pos = BITBOARD_find_bit(blockers | (bitboard_t)0x8000000000000000);
    right_moves ^= bitboard_right[blocker_pos];
    
    /* UP */
    up_moves = bitboard_up[position];
    blockers = up_moves & occupied;
    blocker_pos = BITBOARD_find_bit(blockers | (bitboard_t)0x8000000000000000);
    up_moves ^= bitboard_up[blocker_pos];
    
    /* DOWN */
    down_moves = bitboard_down[position];
    blockers = down_moves & occupied;
    blocker_pos = BITBOARD_find_bit_reversed(blockers | 1);
    down_moves ^= bitboard_down[blocker_pos];
    
    rook_moves = left_moves | right_moves | up_moves | down_moves;
    *moves = rook_moves & ~occupied;
    *captures = rook_moves & opponent;
#endif
}